

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O0

pair<char_*,_char_*> __thiscall
tcmalloc::StringGenericWriter::RecycleBuffer
          (StringGenericWriter *this,char *buf_begin,char *buf_end,int want_at_least)

{
  unsigned_long *puVar1;
  long lVar2;
  char *local_68;
  char *local_60;
  char *ptr;
  unsigned_long local_50;
  unsigned_long local_48;
  size_t new_size;
  size_t size;
  int deficit;
  int want_at_least_local;
  char *buf_end_local;
  char *buf_begin_local;
  StringGenericWriter *this_local;
  
  this->unused_size_ = this->unused_size_ - ((int)buf_end - (int)buf_begin);
  size._0_4_ = want_at_least - this->unused_size_;
  size._4_4_ = want_at_least;
  _deficit = buf_end;
  buf_end_local = buf_begin;
  buf_begin_local = (char *)this;
  new_size = std::__cxx11::string::size();
  if (0 < (int)size) {
    local_50 = new_size + (long)(int)size;
    ptr = (char *)(new_size << 1);
    puVar1 = std::max<unsigned_long>(&local_50,(unsigned_long *)&ptr);
    local_48 = *puVar1;
    std::__cxx11::string::resize((ulong)this->s_);
    this->unused_size_ = this->unused_size_ + ((int)local_48 - (int)new_size);
    new_size = local_48;
  }
  lVar2 = std::__cxx11::string::data();
  local_60 = (char *)((lVar2 + new_size) - (long)this->unused_size_);
  local_68 = local_60 + this->unused_size_;
  std::pair<char_*,_char_*>::pair<char_*&,_char_*,_true>
            ((pair<char_*,_char_*> *)&this_local,&local_60,&local_68);
  return _this_local;
}

Assistant:

std::pair<char*, char*> StringGenericWriter::RecycleBuffer(char* buf_begin, char* buf_end, int want_at_least) {
  unused_size_ -= buf_end - buf_begin;

  int deficit = want_at_least - unused_size_;
  size_t size = s_->size();
  if (deficit > 0) {
    size_t new_size = std::max(size + deficit, size * 2);
    s_->resize(new_size);
    unused_size_ += new_size - size;
    size = new_size;
  }

  char* ptr = const_cast<char*>(s_->data() + size - unused_size_);
  return {ptr, ptr + unused_size_};
}